

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O0

void insert_msg(borg_read_messages *msgs,borg_read_message *msg,int spell_number)

{
  bool bVar1;
  _Bool _Var2;
  borg_read_message *pbVar3;
  int *piVar4;
  int local_20;
  _Bool found_dup;
  int i;
  int spell_number_local;
  borg_read_message *msg_local;
  borg_read_messages *msgs_local;
  
  bVar1 = false;
  if (msgs->messages == (borg_read_message *)0x0) {
    msgs->allocated = 10;
    pbVar3 = (borg_read_message *)mem_alloc((long)msgs->allocated * 0x18);
    msgs->messages = pbVar3;
    piVar4 = (int *)mem_alloc((long)msgs->allocated << 2);
    msgs->index = piVar4;
  }
  if (msg == (borg_read_message *)0x0) {
    msgs->messages[msgs->count].message_p1 = (char *)0x0;
    msgs->messages[msgs->count].message_p2 = (char *)0x0;
    msgs->messages[msgs->count].message_p3 = (char *)0x0;
    msgs->count = msgs->count + 1;
    pbVar3 = (borg_read_message *)mem_realloc(msgs->messages,(long)msgs->count * 0x18);
    msgs->messages = pbVar3;
    piVar4 = (int *)mem_realloc(msgs->index,(long)msgs->count << 2);
    msgs->index = piVar4;
    msgs->allocated = msgs->count;
  }
  else {
    for (local_20 = 0; local_20 < msgs->count; local_20 = local_20 + 1) {
      _Var2 = borg_read_message_equal(msgs->messages + local_20,msg);
      if (_Var2) {
        bVar1 = true;
        break;
      }
    }
    if (bVar1) {
      string_free(msg->message_p1);
      string_free(msg->message_p2);
      string_free(msg->message_p3);
    }
    else {
      pbVar3 = msgs->messages + msgs->count;
      pbVar3->message_p1 = msg->message_p1;
      pbVar3->message_p2 = msg->message_p2;
      pbVar3->message_p3 = msg->message_p3;
      msgs->index[msgs->count] = spell_number;
      msgs->count = msgs->count + 1;
      if (msgs->count == msgs->allocated) {
        msgs->allocated = msgs->allocated + 10;
        pbVar3 = (borg_read_message *)mem_realloc(msgs->messages,(long)msgs->allocated * 0x18);
        msgs->messages = pbVar3;
        piVar4 = (int *)mem_realloc(msgs->index,(long)msgs->allocated << 2);
        msgs->index = piVar4;
      }
    }
  }
  return;
}

Assistant:

static void insert_msg(struct borg_read_messages *msgs,
    struct borg_read_message *msg, int spell_number)
{
    int  i;
    bool found_dup = false;

    /* this way we don't have to pre-create the array */
    if (msgs->messages == NULL) {
        msgs->allocated = 10;
        msgs->messages
            = mem_alloc(sizeof(struct borg_read_message) * msgs->allocated);
        msgs->index = mem_alloc(sizeof(int) * msgs->allocated);
    }

    if (msg == NULL) {
        msgs->messages[msgs->count].message_p1 = NULL;
        msgs->messages[msgs->count].message_p2 = NULL;
        msgs->messages[msgs->count].message_p3 = NULL;
        msgs->count++;
        /* shrink array down, we are done*/
        msgs->messages = mem_realloc(
            msgs->messages, sizeof(struct borg_read_message) * msgs->count);
        msgs->index     = mem_realloc(msgs->index, sizeof(int) * msgs->count);
        msgs->allocated = msgs->count;
        return;
    }

    for (i = 0; i < msgs->count; i++) {
        if (borg_read_message_equal(&msgs->messages[i], msg)) {
            found_dup = true;
            break;
        }
    }
    if (!found_dup) {
        memcpy(&(msgs->messages[msgs->count]), msg,
            sizeof(struct borg_read_message));
        msgs->index[msgs->count] = spell_number;
        msgs->count++;
        if (msgs->count == msgs->allocated) {
            msgs->allocated += 10;
            msgs->messages = mem_realloc(msgs->messages,
                sizeof(struct borg_read_message) * msgs->allocated);
            msgs->index
                = mem_realloc(msgs->index, sizeof(int) * msgs->allocated);
        }
    } else {
        string_free(msg->message_p1);
        string_free(msg->message_p2);
        string_free(msg->message_p3);
    }
}